

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_b9;
  string local_b8;
  TPZQuadraticPrism local_98;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"TPZGeoElRefLess",&local_b9);
  uVar1 = Hash(&local_b8);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZQuadraticPrism::TPZQuadraticPrism(&local_98);
  iVar3 = pzgeom::TPZQuadraticPrism::ClassId(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}